

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodecompile.cc
# Opt level: O3

ExprTree * __thiscall
PcodeCompile::createUserOp
          (PcodeCompile *this,UserOpSymbol *sym,
          vector<ExprTree_*,_std::allocator<ExprTree_*>_> *param)

{
  VarnodeTpl *vn;
  ExprTree *pEVar1;
  vector<OpTpl_*,_std::allocator<OpTpl_*>_> *pvVar2;
  VarnodeTpl *this_00;
  
  vn = buildTemporary(this);
  pEVar1 = (ExprTree *)operator_new(0x10);
  pEVar1->outvn = (VarnodeTpl *)0x0;
  pvVar2 = createUserOpNoOut(this,sym,param);
  pEVar1->ops = pvVar2;
  (pvVar2->super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>)._M_impl.super__Vector_impl_data.
  _M_finish[-1]->output = vn;
  this_00 = (VarnodeTpl *)operator_new(0x68);
  VarnodeTpl::VarnodeTpl(this_00,vn);
  pEVar1->outvn = this_00;
  return pEVar1;
}

Assistant:

ExprTree *PcodeCompile::createUserOp(UserOpSymbol *sym,vector<ExprTree *> *param)

{ // Create userdefined pcode op, given symbol and parameters
  VarnodeTpl *outvn = buildTemporary();
  ExprTree *res = new ExprTree();
  res->ops = createUserOpNoOut(sym,param);
  res->ops->back()->setOutput(outvn);
  res->outvn = new VarnodeTpl(*outvn);
  return res;
}